

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student_t_dist.hpp
# Opt level: O0

result_type_conflict2 __thiscall
trng::student_t_dist<double>::pdf(student_t_dist<double> *this,result_type_conflict2 x)

{
  int iVar1;
  int iVar2;
  param_type *in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  double dVar4;
  double dVar5;
  result_type_conflict2 norm;
  
  param_type::nu(in_RDI);
  dVar3 = math::ln_Gamma(1.72249762195413e-317);
  param_type::nu(in_RDI);
  dVar4 = math::ln_Gamma(1.72251540831738e-317);
  dVar3 = exp(dVar3 - dVar4);
  iVar1 = param_type::nu(in_RDI);
  dVar4 = sqrt((double)iVar1 * 3.141592653589793);
  iVar1 = param_type::nu(in_RDI);
  iVar2 = param_type::nu(in_RDI);
  dVar5 = pow((in_XMM0_Qa * in_XMM0_Qa) / (double)iVar1 + 1.0,(double)(iVar2 + 1) / -2.0);
  return (dVar3 / dVar4) * dVar5;
}

Assistant:

pdf(result_type x) const {
      const result_type norm{math::exp(math::ln_Gamma((P.nu() + 1) / result_type(2)) -
                                       math::ln_Gamma(P.nu() / result_type(2))) /
                             math::sqrt(math::constants<result_type>::pi * P.nu())};
      return norm * math::pow(1 + x * x / P.nu(), (P.nu() + 1) / result_type(-2));
    }